

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::storagetype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  ParseDeclsCtx *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_d5;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  Ok local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseDeclsCtx *local_18;
  ParseDeclsCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  local_28 = sv("i8",2);
  bVar2 = Lexer::takeKeyword(&ctx->in,local_28);
  pPVar1 = local_18;
  if (bVar2) {
    NullTypeParserCtx::makeI8((NullTypeParserCtx *)local_18);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_29);
  }
  else {
    expected = sv("i16",3);
    bVar2 = Lexer::takeKeyword(&pPVar1->in,expected);
    if (bVar2) {
      NullTypeParserCtx::makeI16((NullTypeParserCtx *)local_18);
      Result<wasm::Ok>::Result<wasm::Ok>
                (__return_storage_ptr__,
                 (Ok *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    }
    else {
      __return_storage_ptr___00 =
           (__index_type *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      valtype<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::Ok> *)__return_storage_ptr___00,local_18);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)local_98,(Result<wasm::Ok> *)__return_storage_ptr___00);
      local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_98);
      bVar2 = local_b0 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_d0,local_b0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
        wasm::Err::~Err(&local_d0);
      }
      local_d4 = (uint)bVar2;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_98);
      pPVar1 = local_18;
      if (local_d4 == 0) {
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullTypeParserCtx::makeStorageType((NullTypeParserCtx *)pPVar1);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d5);
        local_d4 = 1;
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> storagetype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i8"sv)) {
    return ctx.makeI8();
  }
  if (ctx.in.takeKeyword("i16"sv)) {
    return ctx.makeI16();
  }
  auto type = valtype(ctx);
  CHECK_ERR(type);
  return ctx.makeStorageType(*type);
}